

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void print_node(c2m_ctx_t c2m_ctx,FILE *f,node_t_conflict n,int indent,int attr_p)

{
  node_code_t nVar1;
  byte *pbVar2;
  void *pvVar3;
  int __c;
  byte bVar4;
  node_t_conflict pnVar5;
  code *pcVar6;
  uint uVar7;
  code *pcVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  pos_t pos;
  undefined8 uStack_50;
  
  fprintf((FILE *)f,"%6u: ",(ulong)n->uid);
  uVar7 = ~(indent >> 0x1f) & indent;
  while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
    fputc(0x20,(FILE *)f);
  }
  if (n == &err_struct) {
    fwrite("<error>\n",8,1,(FILE *)f);
    return;
  }
  if (0x80 < (ulong)n->code) {
switchD_0014982c_default:
    abort();
  }
  fprintf((FILE *)f,"%s (",&DAT_00189464 + *(int *)(&DAT_00189464 + (ulong)n->code * 4));
  pos = get_node_pos(c2m_ctx,n);
  print_pos(f,pos,0);
  fputc(0x29,(FILE *)f);
  nVar1 = n->code;
  switch(nVar1) {
  case N_IGNORE:
    goto switchD_0014982c_caseD_0;
  case N_I:
    pcVar9 = (n->u).s.s;
    pcVar10 = " %lld";
    break;
  case N_L:
    pcVar9 = (n->u).s.s;
    pcVar10 = " %lldl";
    break;
  case N_LL:
    pcVar9 = (n->u).s.s;
    pcVar10 = " %lldll";
    break;
  case N_U:
    pcVar9 = (n->u).s.s;
    pcVar10 = " %lluu";
    break;
  case N_UL:
    pcVar9 = (n->u).s.s;
    pcVar10 = " %lluul";
    break;
  case N_ULL:
    pcVar9 = (n->u).s.s;
    pcVar10 = " %lluull";
    break;
  case N_F:
    pcVar9 = (char *)(double)(n->u).f;
    uStack_50 = 0x18;
    goto LAB_00149ccc;
  case N_D:
    pcVar9 = (n->u).s.s;
    uStack_50 = 0x35;
LAB_00149ccc:
    fprintf((FILE *)f," %.*g",pcVar9,uStack_50);
    goto LAB_00149cd7;
  case N_LD:
    fprintf((FILE *)f," %.*Lg",0x40);
    goto LAB_00149cd7;
  case N_CH:
  case N_CH16:
  case N_CH32:
    pcVar9 = "U";
    if (nVar1 == N_CH16) {
      pcVar9 = "u";
    }
    pcVar10 = "";
    if (nVar1 != N_CH) {
      pcVar10 = pcVar9;
    }
    fprintf((FILE *)f," %s\'",pcVar10);
    print_char(f,(long)(n->u).ch);
    __c = 0x27;
    goto LAB_00149a5b;
  case N_STR:
  case N_STR16:
  case N_STR32:
    pcVar9 = "U";
    if (nVar1 == N_STR16) {
      pcVar9 = "u";
    }
    pcVar10 = "";
    if (nVar1 != N_STR) {
      pcVar10 = pcVar9;
    }
    fprintf((FILE *)f," %s\"",pcVar10);
    pcVar6 = print_chars32;
    if (n->code == N_STR16) {
      pcVar6 = print_chars16;
    }
    pcVar8 = print_chars;
    if (n->code != N_STR) {
      pcVar8 = pcVar6;
    }
    (*pcVar8)(f,(n->u).s.s,(n->u).s.len);
    __c = 0x22;
LAB_00149a5b:
    fputc(__c,(FILE *)f);
    goto LAB_00149cd7;
  case N_ID:
    pcVar9 = (n->u).s.s;
    pcVar10 = " %s";
    break;
  case N_COMMA:
  case N_ANDAND:
  case N_OROR:
  case N_STMTEXPR:
  case N_EQ:
  case N_NE:
  case N_LT:
  case N_LE:
  case N_GT:
  case N_GE:
  case N_ASSIGN:
  case N_BITWISE_NOT:
  case N_NOT:
  case N_AND:
  case N_AND_ASSIGN:
  case N_OR:
  case N_OR_ASSIGN:
  case N_XOR:
  case N_XOR_ASSIGN:
  case N_LSH:
  case N_LSH_ASSIGN:
  case N_RSH:
  case N_RSH_ASSIGN:
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_MUL:
  case N_MUL_ASSIGN:
  case N_DIV:
  case N_DIV_ASSIGN:
  case N_MOD:
  case N_MOD_ASSIGN:
  case N_IND:
  case N_FIELD:
  case N_ADDR:
  case N_DEREF:
  case N_DEREF_FIELD:
  case N_COND:
  case N_INC:
  case N_DEC:
  case N_POST_INC:
  case N_POST_DEC:
  case N_ALIGNOF:
  case N_SIZEOF:
  case N_EXPR_SIZEOF:
  case N_CAST:
  case N_COMPOUND_LITERAL:
  case N_CALL:
  case N_GENERIC:
  case N_LABEL_ADDR:
    if ((attr_p != 0) && ((expr_conflict *)n->attr != (expr_conflict *)0x0)) {
      print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
    }
  case N_GENERIC_ASSOC:
  case N_IF:
  case N_WHILE:
  case N_DO:
  case N_CONTINUE:
  case N_BREAK:
  case N_RETURN:
  case N_EXPR:
  case N_CASE:
  case N_DEFAULT:
  case N_LABEL:
  case N_SHARE:
  case N_TYPEDEF:
  case N_EXTERN:
  case N_STATIC:
  case N_AUTO:
  case N_REGISTER:
  case N_THREAD_LOCAL:
  case N_DECL:
  case N_VOID:
  case N_CHAR:
  case N_SHORT:
  case N_INT:
  case N_LONG:
  case N_FLOAT:
  case N_DOUBLE:
  case N_SIGNED:
  case N_UNSIGNED:
  case N_BOOL:
  case N_CONST:
  case N_RESTRICT:
  case N_VOLATILE:
  case N_ATOMIC:
  case N_INLINE:
  case N_NO_RETURN:
  case N_ALIGNAS:
  case N_STAR:
  case N_POINTER:
  case N_DOTS:
  case N_ARR:
  case N_INIT:
  case N_FIELD_ID:
  case N_TYPE:
  case N_ST_ASSERT:
  case N_ASM:
  case N_ATTR:
    goto switchD_0014982c_caseD_43;
  case N_SWITCH:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": ",2,1,(FILE *)f);
      print_type(c2m_ctx,f,(type *)n->attr);
    }
    goto switchD_0014982c_caseD_43;
  case N_FOR:
  case N_BLOCK:
  case N_STRUCT:
  case N_UNION:
  case N_MODULE:
    bVar11 = attr_p == 0;
    if (bVar11) {
LAB_001498c7:
      fputc(10,(FILE *)f);
    }
    else {
      if ((nVar1 & ~N_I) == N_STRUCT) {
        pnVar5 = DLIST_node_t_el(&(n->u).ops,1);
        if ((pnVar5 == (node_t_conflict)0x0) || (pnVar5->code == N_IGNORE)) goto LAB_001498c7;
LAB_00149bfc:
        if (n->attr != (void *)0x0) {
          bVar11 = false;
          fprintf((FILE *)f,": higher scope node %u",
                  (ulong)*(uint *)(*(long *)((long)n->attr + 0x20) + 4));
          goto LAB_00149c25;
        }
      }
      else {
        if (nVar1 != N_MODULE) goto LAB_00149bfc;
        fwrite(": the top scope",0xf,1,(FILE *)f);
      }
      bVar11 = false;
    }
LAB_00149c25:
    if ((n->code & ~N_I) != N_STRUCT) {
      if ((!bVar11) && (pvVar3 = n->attr, pvVar3 != (void *)0x0)) {
        fprintf((FILE *)f,", size = %llu, offset = %llu\n",*(undefined8 *)((long)pvVar3 + 8),
                *(undefined8 *)((long)pvVar3 + 0x10));
      }
      goto LAB_00149855;
    }
    goto LAB_00149c30;
  case N_GOTO:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fprintf((FILE *)f,": target node %u\n",(ulong)*(uint *)((long)n->attr + 4));
    }
  case N_INDIRECT_GOTO:
    goto switchD_0014982c_caseD_4a;
  case N_LIST:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": ",2,1,(FILE *)f);
      print_decl_spec(c2m_ctx,f,(decl_spec *)n->attr);
    }
switchD_0014982c_caseD_43:
    fputc(10,(FILE *)f);
    goto switchD_0014982c_caseD_4a;
  case N_SPEC_DECL:
  case N_MEMBER:
  case N_FUNC_DEF:
    if ((attr_p != 0) && (pbVar2 = (byte *)n->attr, pbVar2 != (byte *)0x0)) {
      fwrite(": ",2,1,(FILE *)f);
      if (*(long *)(pbVar2 + 0x18) != 0) {
        fprintf((FILE *)f,"scope node = %u, ",(ulong)*(uint *)(*(long *)(pbVar2 + 0x18) + 4));
      }
      print_decl_spec(c2m_ctx,f,(decl_spec *)(pbVar2 + 0x28));
      bVar4 = *pbVar2;
      if ((bVar4 & 1) != 0) {
        fwrite(", addressable",0xd,1,(FILE *)f);
        bVar4 = *pbVar2;
      }
      if ((bVar4 & 8) != 0) {
        fwrite(", used",6,1,(FILE *)f);
        bVar4 = *pbVar2;
      }
      if ((bVar4 & 2) == 0) {
        fprintf((FILE *)f,", offset = %llu",*(undefined8 *)(pbVar2 + 0x10));
        if (-1 < *(int *)(pbVar2 + 4)) {
          fprintf((FILE *)f,", bit offset = %d");
        }
      }
      else {
        fwrite(", reg",5,1,(FILE *)f);
      }
      if ((*pbVar2 & 4) != 0) {
        fprintf((FILE *)f,", asm=%s",*(undefined8 *)(pbVar2 + 0x50));
      }
    }
    goto LAB_00149c30;
  case N_ENUM:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": enum_basic_type = ",0x14,1,(FILE *)f);
      print_basic_type(f,*n->attr);
      goto switchD_0014982c_caseD_43;
    }
    goto switchD_0014982c_caseD_4a;
  case N_ENUM_CONST:
    if ((attr_p != 0) && ((undefined8 *)n->attr != (undefined8 *)0x0)) {
      fprintf((FILE *)f,": val = %lld\n",*n->attr);
    }
switchD_0014982c_caseD_4a:
LAB_00149855:
    print_ops(c2m_ctx,f,n,indent,attr_p);
    return;
  case N_FUNC:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) goto LAB_00149bfc;
LAB_00149c30:
    fputc(10,(FILE *)f);
    goto LAB_00149855;
  default:
    goto switchD_0014982c_default;
  }
  fprintf((FILE *)f,pcVar10,pcVar9);
LAB_00149cd7:
  if ((attr_p != 0) && ((expr_conflict *)n->attr != (expr_conflict *)0x0)) {
    print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
  }
switchD_0014982c_caseD_0:
  fputc(10,(FILE *)f);
  return;
}

Assistant:

static void print_node (c2m_ctx_t c2m_ctx, FILE *f, node_t n, int indent, int attr_p) {
  int i;

  fprintf (f, "%6u: ", n->uid);
  for (i = 0; i < indent; i++) fprintf (f, " ");
  if (n == err_node) {
    fprintf (f, "<error>\n");
    return;
  }
  fprintf (f, "%s (", get_node_name (n->code));
  print_pos (f, POS (n), FALSE);
  fprintf (f, ")");
  switch (n->code) {
  case N_IGNORE: fprintf (f, "\n"); break;
  case N_I: fprintf (f, " %lld", (long long) n->u.l); goto expr;
  case N_L: fprintf (f, " %lldl", (long long) n->u.l); goto expr;
  case N_LL: fprintf (f, " %lldll", (long long) n->u.ll); goto expr;
  case N_U: fprintf (f, " %lluu", (unsigned long long) n->u.ul); goto expr;
  case N_UL: fprintf (f, " %lluul", (unsigned long long) n->u.ul); goto expr;
  case N_ULL: fprintf (f, " %lluull", (unsigned long long) n->u.ull); goto expr;
  case N_F: fprintf (f, " %.*g", FLT_MANT_DIG, (double) n->u.f); goto expr;
  case N_D: fprintf (f, " %.*g", DBL_MANT_DIG, (double) n->u.d); goto expr;
  case N_LD: fprintf (f, " %.*Lg", LDBL_MANT_DIG, (long double) n->u.ld); goto expr;
  case N_CH:
  case N_CH16:
  case N_CH32:
    fprintf (f, " %s'", n->code == N_CH ? "" : n->code == N_CH16 ? "u" : "U");
    print_char (f, n->u.ch);
    fprintf (f, "'");
    goto expr;
  case N_STR:
  case N_STR16:
  case N_STR32:
    fprintf (f, " %s\"", n->code == N_STR ? "" : n->code == N_STR16 ? "u" : "U");
    (n->code == N_STR     ? print_chars
     : n->code == N_STR16 ? print_chars16
                          : print_chars32) (f, n->u.s.s, n->u.s.len);
    fprintf (f, "\"");
    goto expr;
  case N_ID:
    fprintf (f, " %s", n->u.s.s);
  expr:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    break;
  case N_COMMA:
  case N_ANDAND:
  case N_OROR:
  case N_EQ:
  case N_NE:
  case N_LT:
  case N_LE:
  case N_GT:
  case N_GE:
  case N_ASSIGN:
  case N_BITWISE_NOT:
  case N_NOT:
  case N_AND:
  case N_AND_ASSIGN:
  case N_OR:
  case N_OR_ASSIGN:
  case N_XOR:
  case N_XOR_ASSIGN:
  case N_LSH:
  case N_LSH_ASSIGN:
  case N_RSH:
  case N_RSH_ASSIGN:
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_MUL:
  case N_MUL_ASSIGN:
  case N_DIV:
  case N_DIV_ASSIGN:
  case N_MOD:
  case N_MOD_ASSIGN:
  case N_IND:
  case N_FIELD:
  case N_ADDR:
  case N_DEREF:
  case N_DEREF_FIELD:
  case N_COND:
  case N_INC:
  case N_DEC:
  case N_POST_INC:
  case N_POST_DEC:
  case N_ALIGNOF:
  case N_SIZEOF:
  case N_EXPR_SIZEOF:
  case N_CAST:
  case N_COMPOUND_LITERAL:
  case N_CALL:
  case N_GENERIC:
  case N_STMTEXPR:
  case N_LABEL_ADDR:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GENERIC_ASSOC:
  case N_IF:
  case N_WHILE:
  case N_DO:
  case N_CONTINUE:
  case N_BREAK:
  case N_RETURN:
  case N_EXPR:
  case N_CASE:
  case N_DEFAULT:
  case N_LABEL:
  case N_SHARE:
  case N_TYPEDEF:
  case N_EXTERN:
  case N_STATIC:
  case N_AUTO:
  case N_REGISTER:
  case N_THREAD_LOCAL:
  case N_DECL:
  case N_VOID:
  case N_CHAR:
  case N_SHORT:
  case N_INT:
  case N_LONG:
  case N_FLOAT:
  case N_DOUBLE:
  case N_SIGNED:
  case N_UNSIGNED:
  case N_BOOL:
  case N_CONST:
  case N_RESTRICT:
  case N_VOLATILE:
  case N_ATOMIC:
  case N_INLINE:
  case N_NO_RETURN:
  case N_ALIGNAS:
  case N_STAR:
  case N_POINTER:
  case N_DOTS:
  case N_ARR:
  case N_INIT:
  case N_FIELD_ID:
  case N_TYPE:
  case N_ST_ASSERT:
  case N_ASM:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ATTR:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_LIST:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_decl_spec (c2m_ctx, f, (struct decl_spec *) n->attr);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SPEC_DECL:
  case N_MEMBER:
  case N_FUNC_DEF:
    if (attr_p && n->attr != NULL) print_decl (c2m_ctx, f, (decl_t) n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_FUNC:
    if (!attr_p || n->attr == NULL) {
      fprintf (f, "\n");
      print_ops (c2m_ctx, f, n, indent, attr_p);
      break;
    }
    /* fall through */
  case N_STRUCT:
  case N_UNION:
  case N_MODULE:
  case N_BLOCK:
  case N_FOR:
    if (!attr_p
        || ((n->code == N_STRUCT || n->code == N_UNION)
            && (NL_EL (n->u.ops, 1) == NULL || NL_EL (n->u.ops, 1)->code == N_IGNORE)))
      fprintf (f, "\n");
    else if (n->code == N_MODULE)
      fprintf (f, ": the top scope");
    else if (n->attr != NULL)
      fprintf (f, ": higher scope node %u", ((struct node_scope *) n->attr)->scope->uid);
    if (n->code == N_STRUCT || n->code == N_UNION)
      fprintf (f, "\n");
    else if (attr_p && n->attr != NULL)
      fprintf (f, ", size = %llu, offset = %llu\n",
               (unsigned long long) ((struct node_scope *) n->attr)->size,
               (unsigned long long) ((struct node_scope *) n->attr)->offset);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SWITCH:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_type (c2m_ctx, f, &((struct switch_attr *) n->attr)->type);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GOTO:
    if (attr_p && n->attr != NULL) fprintf (f, ": target node %u\n", ((node_t) n->attr)->uid);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_INDIRECT_GOTO: print_ops (c2m_ctx, f, n, indent, attr_p); break;
  case N_ENUM:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": enum_basic_type = ");
      print_basic_type (f, ((struct enum_type *) n->attr)->enum_basic_type);
      fprintf (f, "\n");
    }
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ENUM_CONST:
    if (attr_p && n->attr != NULL)  // ???!!!
      fprintf (f, ": val = %lld\n", (long long) ((struct enum_value *) n->attr)->u.i_val);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  default: abort ();
  }
}